

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decide.cpp
# Opt level: O1

void get_CH(double *p1,int n,int *ch1)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  if (n < 1) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    uVar2 = 1;
    do {
      dVar4 = p1[uVar2] * p1[uVar2];
      p1[uVar2] = dVar4;
      dVar3 = dVar3 + dVar4;
      uVar2 = uVar2 + 1;
    } while (n + 1 != uVar2);
  }
  if (0 < n) {
    uVar2 = 1;
    do {
      p1[uVar2] = p1[uVar2] / dVar3;
      uVar2 = uVar2 + 1;
    } while (n + 1 != uVar2);
  }
  iVar1 = rand();
  if (0 < n) {
    dVar3 = 0.0;
    uVar2 = 0;
    do {
      dVar3 = dVar3 + p1[uVar2 + 1];
      if ((double)(iVar1 % 10000) / 10000.0 < dVar3) {
        *ch1 = (int)uVar2;
        return;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return;
}

Assistant:

void get_CH(double *p1, int n, int &ch1)
{
    double sum;
    double rd;
    int i;
    if(CHOOSE_TYPE==1)
    {
        sum = 0;
        rd = (double)(rand()%10000) / 10000.0;
        for (i = 1; i <= n; i++)
            if(sum + p1[i] > rd)
            {
                ch1 = i - 1;
                break;
            }
            else sum += p1[i];
    }
    else if(CHOOSE_TYPE==2||CHOOSE_TYPE==4)//把概率平方处理
    {
        //先平方，然后归一化一下
        sum = 0;
        for (i = 1; i <= n; i++)
        {
            if(CHOOSE_TYPE==2)
                p1[i]=p1[i]*p1[i];
            else p1[i]=pow(p1[i],1.5);
            sum+=p1[i];
        }
        for (i = 1; i <= n; i++)
            p1[i]=p1[i]/sum;
        sum=0;

        rd = (double)(rand()%10000) / 10000.0;
        for (i = 1; i <= n; i++)
            if(sum + p1[i] > rd)
            {
                ch1 = i - 1;
                break;
            }
            else sum += p1[i];
    }
    else if(CHOOSE_TYPE==3)//直接选个概率最大的。。。
    {
        double max_pro=0;
        for (i = 1; i <= n; i++)
            if(p1[i] > max_pro)
            {
                max_pro=p1[i];
                ch1=i-1;
            }
    }
}